

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

bool Assimp::IFC::BoundingBoxesAdjacent(BoundingBox *bb,BoundingBox *ibb)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = (bb->second).x;
  dVar2 = (ibb->first).x;
  if (((1.1920928955078125e-07 <= ABS(dVar1 - dVar2)) || ((ibb->second).y < (bb->first).y)) ||
     ((bb->second).y < (ibb->first).y)) {
    dVar3 = (bb->first).x;
    dVar4 = (ibb->second).x;
    if ((((1.1920928955078125e-07 <= ABS(dVar3 - dVar4)) || ((bb->second).y < (ibb->first).y)) ||
        ((ibb->second).y < (bb->first).y)) &&
       (((1.1920928955078125e-07 <= ABS((bb->second).y - (ibb->first).y) || (dVar4 < dVar3)) ||
        (dVar1 < dVar2)))) {
      return (bool)(dVar3 <= dVar4 &
                   -(ABS((bb->first).y - (ibb->second).y) < 1.1920928955078125e-07) &
                   -(dVar2 <= dVar1));
    }
  }
  return true;
}

Assistant:

bool BoundingBoxesAdjacent(const BoundingBox& bb, const BoundingBox& ibb)
{
    // TODO: I'm pretty sure there is a much more compact way to check this
    const IfcFloat epsilon = Math::getEpsilon<float>();
    return  (std::fabs(bb.second.x - ibb.first.x) < epsilon && bb.first.y <= ibb.second.y && bb.second.y >= ibb.first.y) ||
        (std::fabs(bb.first.x - ibb.second.x) < epsilon && ibb.first.y <= bb.second.y && ibb.second.y >= bb.first.y) ||
        (std::fabs(bb.second.y - ibb.first.y) < epsilon && bb.first.x <= ibb.second.x && bb.second.x >= ibb.first.x) ||
        (std::fabs(bb.first.y - ibb.second.y) < epsilon && ibb.first.x <= bb.second.x && ibb.second.x >= bb.first.x);
}